

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyle::SetTextMask(ON_DimStyle *this,ON_TextMask *mask)

{
  bool bDraw;
  MaskType source;
  MaskFrame source_00;
  ON_Color color;
  double border;
  undefined1 local_40 [8];
  ON_TextMask local_mask;
  ON_TextMask *mask_local;
  ON_DimStyle *this_local;
  
  local_mask.m_content_hash.m_digest._12_8_ = mask;
  memcpy(local_40,mask,0x28);
  bDraw = ON_TextMask::DrawTextMask((ON_TextMask *)local_40);
  SetDrawTextMask(this,bDraw);
  color = ON_TextMask::MaskColor((ON_TextMask *)local_40);
  SetMaskColor(this,color);
  source = ON_TextMask::MaskFillType((ON_TextMask *)local_40);
  SetMaskFillType(this,source);
  border = ON_TextMask::MaskBorder((ON_TextMask *)local_40);
  SetMaskBorder(this,border);
  source_00 = ON_TextMask::MaskFrameType((ON_TextMask *)local_40);
  SetMaskFrameType(this,source_00);
  return;
}

Assistant:

void ON_DimStyle::SetTextMask(const ON_TextMask& mask)
{
  // In order for overrides to work correctly, each text mask property must be
  // set individually.
  const ON_TextMask local_mask(mask);
  SetDrawTextMask(local_mask.DrawTextMask());
  SetMaskColor(local_mask.MaskColor());
  SetMaskFillType(local_mask.MaskFillType());
  SetMaskBorder(local_mask.MaskBorder());
  SetMaskFrameType(local_mask.MaskFrameType());
}